

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_get_description(coda_type *type,char **description)

{
  undefined8 uVar1;
  char *message;
  
  if (type == (coda_type *)0x0) {
    message = "type argument is NULL (%s:%u)";
    uVar1 = 0xbcf;
  }
  else {
    if (description != (char **)0x0) {
      *description = type->description;
      return 0;
    }
    message = "description argument is NULL (%s:%u)";
    uVar1 = 0xbd4;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar1);
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_description(const coda_type *type, const char **description)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (description == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "description argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *description = type->description;
    return 0;
}